

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O2

double __thiscall NEST::LArNEST::GetERElectronYieldsGamma(LArNEST *this,double efield)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar1 = (this->fER).gamma.A;
  dVar2 = (this->fER).gamma.B;
  dVar3 = this->fWorkQuantaFunction;
  dVar4 = (this->fER).gamma.C;
  dVar5 = (this->fER).gamma.D;
  dVar6 = (this->fER).gamma.E;
  dVar7 = pow(efield / (this->fER).gamma.F,(this->fER).gamma.G);
  return ((dVar6 / dVar7 + dVar5) * dVar4 + dVar2 / dVar3) * dVar1;
}

Assistant:

double LArNEST::GetERElectronYieldsGamma(double efield) {
  return fER.gamma.A *
         (fER.gamma.B / fWorkQuantaFunction +
          fER.gamma.C * (fER.gamma.D +
                         fER.gamma.E / pow(efield / fER.gamma.F, fER.gamma.G)));
}